

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

void duckdb::ColumnDataCopy<unsigned_long>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ushort uVar1;
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  bool bVar5;
  reference pvVar6;
  ColumnDataAllocator *this_00;
  data_ptr_t pdVar7;
  idx_t iVar8;
  long lVar9;
  idx_t iVar10;
  ulong uVar11;
  VectorDataIndex prev_index;
  ulong uVar12;
  ValidityMask result_validity;
  idx_t local_a0;
  TemplatedValidityMask<unsigned_long> local_50;
  
  this = meta_data->segment;
  state = meta_data->state;
  prev_index.index = (meta_data->vector_data_index).index;
  local_a0 = offset;
  while (copy_count != 0) {
    pvVar6 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
    uVar12 = (ulong)(0x800 - pvVar6->count);
    if (copy_count <= uVar12) {
      uVar12 = copy_count;
    }
    this_00 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
    pdVar7 = ColumnDataAllocator::GetDataPointer
                       (this_00,&state->current_chunk_state,pvVar6->block_id,pvVar6->offset);
    local_50.validity_mask = (unsigned_long *)(pdVar7 + 0x4000);
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.capacity = 0x800;
    if (pvVar6->count == 0) {
      TemplatedValidityMask<unsigned_long>::SetAllValid(&local_50,0x800);
    }
    if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pSVar3 = source_data->sel;
      pdVar4 = source_data->data;
      uVar1 = pvVar6->count;
      iVar8 = local_a0;
      for (lVar9 = 0; uVar12 * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
        psVar2 = pSVar3->sel_vector;
        iVar10 = iVar8;
        if (psVar2 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar2[iVar8];
        }
        *(undefined8 *)(pdVar7 + lVar9 + (ulong)uVar1 * 8) = *(undefined8 *)(pdVar4 + iVar10 * 8);
        iVar8 = iVar8 + 1;
      }
    }
    else {
      for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
        psVar2 = source_data->sel->sel_vector;
        if (psVar2 == (sel_t *)0x0) {
          iVar8 = local_a0 + uVar11;
        }
        else {
          iVar8 = (idx_t)psVar2[local_a0 + uVar11];
        }
        bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(source_data->validity).super_TemplatedValidityMask<unsigned_long>,iVar8
                          );
        if (bVar5) {
          *(undefined8 *)(pdVar7 + uVar11 * 8 + (ulong)pvVar6->count * 8) =
               *(undefined8 *)(source_data->data + iVar8 * 8);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid(&local_50,pvVar6->count + uVar11);
        }
      }
    }
    pvVar6->count = pvVar6->count + (short)uVar12;
    copy_count = copy_count - uVar12;
    if (copy_count != 0) {
      if ((pvVar6->next_data).index == 0xffffffffffffffff) {
        ColumnDataCollectionSegment::AllocateVector
                  (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index);
      }
      pvVar6 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
      prev_index.index = (pvVar6->next_data).index;
    }
    local_a0 = local_a0 + uVar12;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

static void ColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                           idx_t offset, idx_t copy_count) {
	TemplatedColumnDataCopy<StandardValueCopy<T>>(meta_data, source_data, source, offset, copy_count);
}